

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void conv_fmt_8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                    int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  puVar2 = *dst;
  iVar1 = 0;
  if (0 < height) {
    iVar1 = height;
  }
  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
    memcpy(puVar2,src_y,(long)width);
    src_y = src_y + src_stride;
    puVar2 = puVar2 + *dst_stride;
  }
  uVar8 = width >> ((byte)uv_shift & 0x1f);
  iVar7 = height >> ((byte)uv_shift & 0x1f);
  puVar2 = dst[1];
  iVar1 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  puVar3 = src_uv;
  for (; iVar1 != iVar7; iVar1 = iVar1 + 1) {
    puVar4 = puVar2;
    for (uVar6 = 0; (uint)((int)uVar9 * 2) != uVar6; uVar6 = uVar6 + 2) {
      *puVar4 = puVar3[(int)uVar6];
      puVar4 = puVar4 + 1;
    }
    puVar3 = puVar3 + src_stridec;
    puVar2 = puVar2 + dst_stride[1];
  }
  puVar3 = src_uv + 1;
  puVar2 = dst[2];
  for (iVar1 = 0; iVar1 != iVar7; iVar1 = iVar1 + 1) {
    puVar4 = puVar2;
    for (lVar5 = 0; uVar9 * 2 != lVar5; lVar5 = lVar5 + 2) {
      *puVar4 = puVar3[(int)lVar5];
      puVar4 = puVar4 + 1;
    }
    puVar3 = puVar3 + src_stridec;
    puVar2 = puVar2 + dst_stride[2];
  }
  return;
}

Assistant:

static void conv_fmt_8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    unsigned char* psrc = src_y;
    unsigned char* pdst = dst[0];
    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width);
        psrc += src_stride;
        pdst += dst_stride[0];
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = src_uv;
    pdst = dst[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[1];
    }

    psrc = src_uv + 1;
    pdst = dst[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[2];
    }
}